

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

void Saig_StrSimSetInitMatching(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int local_2c;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  pAVar2 = Aig_ManConst1(p0);
  pAVar3 = Aig_ManConst1(p1);
  Aig_ObjSetRepr(p0,pAVar2,pAVar3);
  Aig_ObjSetRepr(p1,pAVar3,pAVar2);
  for (local_2c = 0; iVar1 = Saig_ManPiNum(p0), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCis,local_2c);
    pAVar3 = Aig_ManCi(p1,local_2c);
    Aig_ObjSetRepr(p0,pAVar2,pAVar3);
    Aig_ObjSetRepr(p1,pAVar3,pAVar2);
  }
  return;
}

Assistant:

void Saig_StrSimSetInitMatching( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    pObj0 = Aig_ManConst1( p0 );
    pObj1 = Aig_ManConst1( p1 );
    Aig_ObjSetRepr( p0, pObj0, pObj1 );
    Aig_ObjSetRepr( p1, pObj1, pObj0 );
    Saig_ManForEachPi( p0, pObj0, i )
    {
        pObj1 = Aig_ManCi( p1, i );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
}